

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcMember::IfcMember(IfcMember *this)

{
  *(undefined ***)&(this->super_IfcBuildingElement).field_0x158 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x160 = 0;
  *(char **)&this->field_0x168 = "IfcMember";
  IfcBuildingElement::IfcBuildingElement
            (&this->super_IfcBuildingElement,&PTR_construction_vtable_24__00792e98);
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject
       = 0x792d68;
  *(undefined8 *)&(this->super_IfcBuildingElement).field_0x158 = 0x792e80;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       0x792d90;
  (this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x792db8;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       0x792de0;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.field_0x100 =
       0x792e08;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x138 = 0x792e30;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x148 = 0x792e58;
  return;
}

Assistant:

IfcMember() : Object("IfcMember") {}